

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b0a42::t_debugger::f_print_value
          (t_debugger *this,t_pvalue *a_value,size_t a_depth)

{
  FILE *pFVar1;
  bool bVar2;
  uintptr_t uVar3;
  t_type tVar4;
  t_object *ptVar5;
  pair<xemmai::t_slot,_xemmai::t_value<xemmai::t_slot>_> *ppVar6;
  t_symbol *this_00;
  wstring *this_01;
  wchar_t *pwVar7;
  t_svalue *ptVar8;
  t_string *this_02;
  t_entry *ptVar9;
  t_value<xemmai::t_pointer> local_88;
  t_value<xemmai::t_pointer> local_78;
  undefined1 local_68 [8];
  t_iterator i_1;
  t_map *map;
  ulong local_38;
  size_t i;
  size_t n;
  t_type *type;
  size_t a_depth_local;
  t_pvalue *a_value_local;
  t_debugger *this_local;
  
  type = (t_type *)a_depth;
  a_depth_local = (size_t)a_value;
  a_value_local = (t_pvalue *)this;
  uVar3 = xemmai::t_value<xemmai::t_pointer>::f_tag(a_value);
  switch(uVar3) {
  case 0:
    fputs("null",(FILE *)this->v_out);
    break;
  case 1:
    fputs("false",(FILE *)this->v_out);
    break;
  case 2:
    fputs("true",(FILE *)this->v_out);
    break;
  case 3:
    pFVar1 = (FILE *)this->v_out;
    tVar4 = xemmai::f_as<long,xemmai::t_value<xemmai::t_pointer>const&>
                      ((t_value<xemmai::t_pointer> *)a_depth_local);
    fprintf(pFVar1,"%ld",tVar4);
    break;
  case 4:
    pFVar1 = (FILE *)this->v_out;
    xemmai::f_as<double,xemmai::t_value<xemmai::t_pointer>const&>
              ((t_value<xemmai::t_pointer> *)a_depth_local);
    fprintf(pFVar1,"%g");
    break;
  default:
    pFVar1 = (FILE *)this->v_out;
    ptVar5 = xemmai::t_pointer::operator_cast_to_t_object_((t_pointer *)a_depth_local);
    fprintf(pFVar1,"@%p",ptVar5);
    type = (t_type *)((long)&type[-1].f_or + 7);
    if (type != (t_type *)0x0) {
      fputc(0x28,(FILE *)this->v_out);
      ptVar5 = xemmai::t_pointer::operator->((t_pointer *)a_depth_local);
      n = (size_t)xemmai::t_object::f_type(ptVar5);
      i = ((t_type *)n)->v_instance_fields;
      if (i != 0) {
        local_38 = 0;
        while( true ) {
          pFVar1 = (FILE *)this->v_out;
          ppVar6 = xemmai::t_type_of<xemmai::t_object>::f_fields((t_type_of<xemmai::t_object> *)n);
          ptVar5 = xemmai::t_slot::operator->(&ppVar6[local_38].first);
          this_00 = xemmai::t_object::f_as<xemmai::t_symbol>(ptVar5);
          this_01 = xemmai::t_symbol::f_string_abi_cxx11_(this_00);
          pwVar7 = std::__cxx11::
                   basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>::c_str
                             (this_01);
          fprintf(pFVar1,"%ls: ",pwVar7);
          ptVar5 = xemmai::t_pointer::operator->((t_pointer *)a_depth_local);
          ptVar8 = xemmai::t_object::f_fields(ptVar5);
          xemmai::t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>
                    ((t_value<xemmai::t_pointer> *)&map,ptVar8 + local_38);
          f_print_value(this,(t_pvalue *)&map,(size_t)type);
          local_38 = local_38 + 1;
          if (i <= local_38) break;
          fputs(", ",(FILE *)this->v_out);
        }
      }
      fputc(0x29,(FILE *)this->v_out);
    }
    ptVar5 = xemmai::t_pointer::operator_cast_to_t_object_((t_pointer *)a_depth_local);
    bVar2 = f_is<xemmai::t_string>(this,ptVar5);
    if (bVar2) {
      pFVar1 = (FILE *)this->v_out;
      ptVar5 = xemmai::t_pointer::operator->((t_pointer *)a_depth_local);
      this_02 = xemmai::t_object::f_as<xemmai::t_string>(ptVar5);
      pwVar7 = xemmai::t_string::operator_cast_to_wchar_t_(this_02);
      fprintf(pFVar1," \"%ls\"",pwVar7);
    }
    else {
      ptVar5 = xemmai::t_pointer::operator_cast_to_t_object_((t_pointer *)a_depth_local);
      bVar2 = f_is<xemmai::t_tuple>(this,ptVar5);
      if (bVar2) {
        fputs(" \'(",(FILE *)this->v_out);
        ptVar5 = xemmai::t_pointer::operator_cast_to_t_object_((t_pointer *)a_depth_local);
        f_print_sequence<xemmai::t_tuple>(this,ptVar5,(size_t)type);
        fputc(0x29,(FILE *)this->v_out);
      }
      else {
        ptVar5 = xemmai::t_pointer::operator_cast_to_t_object_((t_pointer *)a_depth_local);
        bVar2 = f_is<xemmai::t_list>(this,ptVar5);
        if (bVar2) {
          fputs(" [",(FILE *)this->v_out);
          ptVar5 = xemmai::t_pointer::operator_cast_to_t_object_((t_pointer *)a_depth_local);
          f_print_sequence<xemmai::t_list>(this,ptVar5,(size_t)type);
          fputc(0x5d,(FILE *)this->v_out);
        }
        else {
          ptVar5 = xemmai::t_pointer::operator_cast_to_t_object_((t_pointer *)a_depth_local);
          bVar2 = f_is<xemmai::t_map>(this,ptVar5);
          if (bVar2) {
            ptVar5 = xemmai::t_pointer::operator->((t_pointer *)a_depth_local);
            i_1.v_end = (t_entry *)xemmai::t_object::f_as<xemmai::t_map>(ptVar5);
            fputs(" {",(FILE *)this->v_out);
            if (type == (t_type *)0x0) {
              fputs("...",(FILE *)this->v_out);
            }
            else {
              xemmai::t_map::t_iterator::t_iterator((t_iterator *)local_68,(t_map *)i_1.v_end);
              ptVar9 = xemmai::t_map::t_iterator::f_entry((t_iterator *)local_68);
              if (ptVar9 != (t_entry *)0x0) {
                while( true ) {
                  ptVar9 = xemmai::t_map::t_iterator::f_entry((t_iterator *)local_68);
                  ptVar8 = xemmai::t_map::t_entry::f_key(ptVar9);
                  xemmai::t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>(&local_78,ptVar8);
                  f_print_value(this,&local_78,(size_t)type);
                  fputs(": ",(FILE *)this->v_out);
                  ptVar9 = xemmai::t_map::t_iterator::f_entry((t_iterator *)local_68);
                  xemmai::t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>
                            (&local_88,&ptVar9->v_value);
                  f_print_value(this,&local_88,(size_t)type);
                  xemmai::t_map::t_iterator::f_next((t_iterator *)local_68);
                  ptVar9 = xemmai::t_map::t_iterator::f_entry((t_iterator *)local_68);
                  if (ptVar9 == (t_entry *)0x0) break;
                  fputs(", ",(FILE *)this->v_out);
                }
              }
            }
            fputc(0x7d,(FILE *)this->v_out);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void f_print_value(const t_pvalue& a_value, size_t a_depth)
	{
		switch (a_value.f_tag()) {
		case c_tag__NULL:
			std::fputs("null", v_out);
			break;
		case c_tag__FALSE:
			std::fputs("false", v_out);
			break;
		case c_tag__TRUE:
			std::fputs("true", v_out);
			break;
		case c_tag__INTEGER:
			std::fprintf(v_out, "%" PRIdPTR, f_as<intptr_t>(a_value));
			break;
		case c_tag__FLOAT:
			std::fprintf(v_out, "%g", f_as<double>(a_value));
			break;
		default:
			std::fprintf(v_out, "@%p", static_cast<t_object*>(a_value));
			if (--a_depth > 0) {
				std::fputc('(', v_out);
				auto type = a_value->f_type();
				auto n = type->v_instance_fields;
				if (n > 0) {
					size_t i = 0;
					while (true) {
						std::fprintf(v_out, "%ls: ", type->f_fields()[i].first->f_as<t_symbol>().f_string().c_str());
						f_print_value(a_value->f_fields()[i], a_depth);
						if (++i >= n) break;
						std::fputs(", ", v_out);
					}
				}
				std::fputc(')', v_out);
			}
			if (f_is<t_string>(a_value)) {
				std::fprintf(v_out, " \"%ls\"", static_cast<const wchar_t*>(a_value->f_as<t_string>()));
			} else if (f_is<t_tuple>(a_value)) {
				std::fputs(" '(", v_out);
				f_print_sequence<t_tuple>(a_value, a_depth);
				std::fputc(')', v_out);
			} else if (f_is<t_list>(a_value)) {
				std::fputs(" [", v_out);
				f_print_sequence<t_list>(a_value, a_depth);
				std::fputc(']', v_out);
			} else if (f_is<t_map>(a_value)) {
				auto& map = a_value->f_as<t_map>();
				std::fputs(" {", v_out);
				if (a_depth <= 0) {
					std::fputs("...", v_out);
				} else {
					t_map::t_iterator i(map);
					if (i.f_entry()) {
						while (true) {
							f_print_value(i.f_entry()->f_key(), a_depth);
							std::fputs(": ", v_out);
							f_print_value(i.f_entry()->v_value, a_depth);
							i.f_next();
							if (!i.f_entry()) break;
							std::fputs(", ", v_out);
						}
					}
				}
				std::fputc('}', v_out);
			}
		}
	}